

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ProgressBar::reset(ProgressBar *this)

{
  int iVar1;
  ProgressBarPrivate *pPVar2;
  ProgressBar *this_local;
  
  pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  iVar1 = pPVar2->minimum;
  pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  pPVar2->value = iVar1 + -1;
  pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  if (pPVar2->minimum == -0x80000000) {
    pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    pPVar2->value = -0x80000000;
  }
  pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  pPVar2->animate = true;
  pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  QAbstractAnimation::start(pPVar2->animation,0);
  QWidget::repaint();
  return;
}

Assistant:

void
ProgressBar::reset()
{
	d->value = d->minimum - 1;

	if( d->minimum == INT_MIN )
		d->value = INT_MIN;

	d->animate = true;

	d->animation->start();

	repaint();
}